

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tpack(lua_State *L)

{
  int narray;
  int local_14;
  int n;
  int i;
  lua_State *L_local;
  
  narray = lua_gettop(L);
  lua_createtable(L,narray,1);
  lua_rotate(L,1,1);
  for (local_14 = narray; 0 < local_14; local_14 = local_14 + -1) {
    lua_seti(L,1,(long)local_14);
  }
  lua_pushinteger(L,(long)narray);
  lua_setfield(L,1,"n");
  return 1;
}

Assistant:

static int tpack (lua_State *L) {
  int i;
  int n = lua_gettop(L);  /* number of elements to pack */
  lua_createtable(L, n, 1);  /* create result table */
  lua_insert(L, 1);  /* put it at index 1 */
  for (i = n; i >= 1; i--)  /* assign elements */
    lua_seti(L, 1, i);
  lua_pushinteger(L, n);
  lua_setfield(L, 1, "n");  /* t.n = number of elements */
  return 1;  /* return table */
}